

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O1

void __thiscall
YsSoundPlayer::APISpecificData::PopulateWriteBuffer
          (APISpecificData *this,uint *writeBufFilledInNStep,uint wavPtr,SoundData *wavFile,
          YSBOOL loop,int nThSound)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uchar uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar1 = *writeBufFilledInNStep;
  *writeBufFilledInNStep = 0;
  do {
    if (this->bufSizeInNStep <= *writeBufFilledInNStep) break;
    puVar4 = SoundData::DataPointerAtTimeStep(wavFile,wavPtr);
    uVar5 = this->bytePerTimeStep;
    uVar3 = SoundData::SizeInByte(wavFile);
    uVar3 = uVar3 - uVar5 * wavPtr;
    uVar5 = (this->bufSizeInNStep - *writeBufFilledInNStep) * this->bytePerTimeStep;
    if ((int)uVar3 < (int)uVar5) {
      uVar5 = uVar3;
    }
    if (1 < (int)uVar5) {
      uVar8 = 0;
      do {
        iVar7 = (int)uVar8;
        if (nThSound == 0) {
LAB_001139fc:
          this->writeBuf[this->bytePerTimeStep * *writeBufFilledInNStep + iVar7] = puVar4[uVar8];
          uVar6 = puVar4[uVar8 + 1];
        }
        else {
          if (uVar1 < (int)((uVar8 & 0xffffffff) / (ulong)this->bytePerTimeStep) +
                      *writeBufFilledInNStep) goto LAB_001139fc;
          uVar11 = (uint)CONCAT11(puVar4[uVar8 + 1],puVar4[uVar8]);
          uVar3 = uVar11 | 0xffff0000;
          if (-1 < (char)puVar4[uVar8 + 1]) {
            uVar3 = uVar11;
          }
          puVar2 = this->writeBuf;
          iVar9 = this->bytePerTimeStep * *writeBufFilledInNStep;
          uVar10 = iVar7 + iVar9;
          uVar12 = (uint)CONCAT11(puVar2[iVar9 + iVar7 + 1],puVar2[uVar10]);
          uVar11 = uVar12 | 0xffff0000;
          if (-1 < (char)puVar2[iVar9 + iVar7 + 1]) {
            uVar11 = uVar12;
          }
          iVar9 = uVar11 + uVar3;
          if (0x7ffe < iVar9) {
            iVar9 = 0x7fff;
          }
          if (iVar9 < -0x7fff) {
            iVar9 = -0x8000;
          }
          puVar2[uVar10] = (uchar)iVar9;
          uVar6 = (uchar)((uint)iVar9 >> 8);
        }
        this->writeBuf[this->bytePerTimeStep * *writeBufFilledInNStep + iVar7 + 1] = uVar6;
        uVar8 = uVar8 + 2;
      } while ((long)uVar8 <= (long)(int)(uVar5 - 2));
    }
    *writeBufFilledInNStep = *writeBufFilledInNStep + uVar5 / this->bytePerTimeStep;
    uVar3 = uVar5 / this->bytePerTimeStep + wavPtr;
    uVar5 = SoundData::NTimeStep(wavFile);
    wavPtr = uVar3;
    if (loop == YSTRUE) {
      wavPtr = 0;
    }
    if (uVar3 < uVar5) {
      wavPtr = uVar3;
    }
  } while ((loop == YSTRUE) || (uVar3 < uVar5));
  if (*writeBufFilledInNStep < uVar1) {
    *writeBufFilledInNStep = uVar1;
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PopulateWriteBuffer(unsigned int &writeBufFilledInNStep,unsigned int wavPtr,const SoundData *wavFile,YSBOOL loop,int nThSound)
{
	auto currentFilledInNStep=writeBufFilledInNStep;
	writeBufFilledInNStep=0;
	while(writeBufFilledInNStep<bufSizeInNStep)
	{
		const unsigned char *dataPtr=wavFile->DataPointerAtTimeStep(wavPtr);
		const int ptrInByte=wavPtr*bytePerTimeStep;
		const int wavByteLeft=wavFile->SizeInByte()-ptrInByte;
		const int writeBufLeftInByte=(bufSizeInNStep-writeBufFilledInNStep)*bytePerTimeStep;
		
		int nByteToWrite;
		if(wavByteLeft<writeBufLeftInByte)
		{
			nByteToWrite=wavByteLeft;
		}
		else
		{
			nByteToWrite=writeBufLeftInByte;
		}

		for(int i=0; i<=nByteToWrite-2; i+=2)
		{
			if(0==nThSound || currentFilledInNStep<writeBufFilledInNStep+i/bytePerTimeStep)
			{
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=dataPtr[i];
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=dataPtr[i+1];
			}
			else
			{
				int v=(int)dataPtr[i]+(((int)dataPtr[i+1])<<8);
				if(32768<=v)
				{
					v-=65536;
				}
				int c=  (int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i]
				     +(((int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1])<<8);
				if(32768<=c)
				{
					c-=65536;
				}
				v+=c;
				if(32767<v)
				{
					v=32767;
				}
				if(v<-32768)
				{
					v=-32768;
				}
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=v&0xff;
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=((v>>8)&0xff);
			}
		}
		writeBufFilledInNStep+=nByteToWrite/bytePerTimeStep;
		wavPtr+=nByteToWrite/bytePerTimeStep;
		if(wavFile->NTimeStep()<=wavPtr)
		{
			if(YSTRUE!=loop)
			{
				break;
			}
			wavPtr=0;
		}
	}

	if(writeBufFilledInNStep<currentFilledInNStep)
	{
		writeBufFilledInNStep=currentFilledInNStep;
	}
}